

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>>::
makeHouseholder<Eigen::VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>>
           *this,VectorBlock<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1>
                 *essential,Scalar *tau,RealScalar *beta)

{
  RealScalar RVar1;
  double dVar2;
  double dVar3;
  double local_168;
  VectorBlock<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1>
  tail;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_d0;
  
  VectorBlock<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>,_-1>
  ::VectorBlock(&tail,(Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>
                       *)this,1,*(long *)(this + 8) + -1);
  if (*(long *)(this + 8) == 1) {
    dVar3 = **(double **)this;
  }
  else {
    RVar1 = MatrixBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>
            ::squaredNorm((MatrixBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                           *)&tail);
    dVar3 = **(double **)this;
    if (2.2250738585072014e-308 < RVar1) {
      dVar2 = RVar1 + dVar3 * dVar3;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      local_168 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)-dVar2 |
                          (ulong)dVar2 & -(ulong)(dVar3 < 0.0));
      *beta = local_168;
      local_168 = dVar3 - local_168;
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>const,-1,1,false>>
      ::operator/(&local_d0,
                  (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const,_1,1,false>>
                   *)&tail,&local_168);
      internal::
      call_assignment<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const>>
                (&essential->
                  super_Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>
                 ,&local_d0);
      *tau = (*beta - dVar3) / *beta;
      return;
    }
  }
  *tau = 0.0;
  *beta = dVar3;
  DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
             *)essential);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::makeHouseholder(
  EssentialPart& essential,
  Scalar& tau,
  RealScalar& beta) const
{
  using std::sqrt;
  using numext::conj;
  
  EIGEN_STATIC_ASSERT_VECTOR_ONLY(EssentialPart)
  VectorBlock<const Derived, EssentialPart::SizeAtCompileTime> tail(derived(), 1, size()-1);
  
  RealScalar tailSqNorm = size()==1 ? RealScalar(0) : tail.squaredNorm();
  Scalar c0 = coeff(0);
  const RealScalar tol = (std::numeric_limits<RealScalar>::min)();

  if(tailSqNorm <= tol && numext::abs2(numext::imag(c0))<=tol)
  {
    tau = RealScalar(0);
    beta = numext::real(c0);
    essential.setZero();
  }
  else
  {
    beta = sqrt(numext::abs2(c0) + tailSqNorm);
    if (numext::real(c0)>=RealScalar(0))
      beta = -beta;
    essential = tail / (c0 - beta);
    tau = conj((beta - c0) / beta);
  }
}